

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

bool __thiscall re2::Tester::TestInput(Tester *this,StringPiece *text)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  StringPiece sp;
  StringPiece local_40;
  
  bVar2 = true;
  lVar5 = 0;
  do {
    bVar1 = TestCase(this,text,text,*(Anchor *)((long)&anchors + lVar5));
    bVar2 = (bool)(bVar2 & bVar1);
    lVar5 = lVar5 + 4;
  } while (lVar5 == 4);
  if (0 < text->length_) {
    local_40.ptr_ = text->ptr_ + 1;
    local_40.length_ = text->length_ + -1;
    bVar3 = 1;
    lVar5 = 0;
    do {
      bVar1 = TestCase(this,&local_40,text,*(Anchor *)((long)&anchors + lVar5));
      bVar3 = bVar3 & bVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
    local_40.ptr_ = text->ptr_;
    local_40.length_ = text->length_ + -1;
    bVar4 = 1;
    lVar5 = 0;
    do {
      bVar1 = TestCase(this,&local_40,text,*(Anchor *)((long)&anchors + lVar5));
      bVar4 = bVar4 & bVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
    bVar2 = (bool)(bVar2 & bVar3 & bVar4);
  }
  return bVar2;
}

Assistant:

bool Tester::TestInput(const StringPiece& text) {
  bool okay = TestInputInContext(text, text);
  if (text.size() > 0) {
    StringPiece sp;
    sp = text;
    sp.remove_prefix(1);
    okay &= TestInputInContext(sp, text);
    sp = text;
    sp.remove_suffix(1);
    okay &= TestInputInContext(sp, text);
  }
  return okay;
}